

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

void print_snifline(int slot)

{
  byte bVar1;
  byte bVar2;
  __u8 _Var3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t __n;
  uint uVar10;
  long lVar11;
  int __c;
  char *__format;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  lVar5 = (long)slot;
  lVar6 = lVar5 * 0x158;
  lVar11 = sniftab[lVar5].currstamp.tv_usec - sniftab[lVar5].laststamp.tv_usec;
  bVar1 = sniftab[lVar5].last.len;
  bVar2 = sniftab[lVar5].current.len;
  uVar10 = sniftab[lVar5].current.can_id;
  lVar8 = lVar11 + 1000000;
  if (-1 < lVar11) {
    lVar8 = lVar11;
  }
  lVar11 = (lVar11 >> 0x3f) + (sniftab[lVar5].currstamp.tv_sec - sniftab[lVar5].laststamp.tv_sec);
  if (lVar11 < 0) {
    lVar8 = 0;
  }
  lVar9 = 0;
  if (0 < lVar11) {
    lVar9 = lVar11;
  }
  lVar7 = 999999;
  if (lVar11 < 100) {
    lVar7 = lVar8;
  }
  lVar8 = 99;
  if (lVar9 < 99) {
    lVar8 = lVar9;
  }
  pcVar12 = vdl;
  if ((int)uVar10 < 0) {
    uVar14 = (ulong)(uVar10 & 0x1fffffff);
    __format = "%02ld%03ld%s%08X%s";
  }
  else if (print_eff == '\x01') {
    uVar14 = (ulong)(uVar10 & 0x7ff);
    __format = "%02ld%03ld%s---- %03X%s";
  }
  else {
    uVar14 = (ulong)(uVar10 & 0x7ff);
    __format = "%02ld%03ld%s%03X%s";
    pcVar12 = " | ";
  }
  printf(__format,lVar8,lVar7 / 1000,pcVar12,uVar14,pcVar12);
  iVar13 = (uint)bVar1 - (uint)bVar2;
  _Var3 = sniftab[lVar5].current.len;
  if (binary == '\0') {
    if (_Var3 == '\0') {
      uVar10 = 0;
    }
    else {
      uVar14 = 0;
      do {
        if ((color == '\x01') &&
           ((~*(byte *)(lVar6 + 0x107298 + uVar14) & *(byte *)(lVar6 + 0x107250 + uVar14)) != 0)) {
          printf("%s%02X%s ","\x1b[1m\x1b[31m",(ulong)*(byte *)(lVar6 + 0x107208 + uVar14),"\x1b[0m"
                );
        }
        else {
          printf("%02X ");
        }
        uVar14 = uVar14 + 1;
        bVar1 = sniftab[lVar5].current.len;
        uVar10 = (uint)bVar1;
      } while (uVar14 < bVar1);
    }
    _Var3 = (__u8)uVar10;
    if (print_ascii == 0) {
      if (0 < iVar13) {
        do {
          printf("   ");
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
    else {
      uVar4 = 8;
      if (max_dlen != '\0') {
        uVar4 = 0x40;
      }
      if (uVar10 <= uVar4 && uVar4 - uVar10 != 0) {
        printf("%*s",(ulong)((uVar4 - uVar10) * 3),"");
        _Var3 = sniftab[lVar5].current.len;
      }
      if (_Var3 != '\0') {
        uVar14 = 0;
        do {
          bVar1 = *(byte *)(lVar6 + 0x107208 + uVar14);
          if ((byte)(bVar1 - 0x20) < 0x5f) {
            if ((color != '\x01') ||
               ((~*(byte *)(lVar6 + 0x107298 + uVar14) & *(byte *)(lVar6 + 0x107250 + uVar14)) == 0)
               ) {
              uVar10 = (uint)bVar1;
              goto LAB_00103bf9;
            }
            printf("%s%c%s","\x1b[1m\x1b[31m",(ulong)bVar1,"\x1b[0m");
          }
          else {
            uVar10 = 0x2e;
LAB_00103bf9:
            putchar(uVar10);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < sniftab[lVar5].current.len);
      }
      if (0 < iVar13) {
        do {
          putchar(0x20);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
  }
  else {
    if (_Var3 != '\0') {
      uVar14 = 0;
      do {
        uVar10 = 7;
        do {
          if (color == '\0') {
            uVar4 = 1 << ((byte)uVar10 & 0x1f);
LAB_00103a35:
            if ((uVar4 & *(byte *)(lVar6 + 0x107208 + uVar14)) == 0) {
              __c = 0x30;
            }
            else {
              __c = 0x31;
            }
            putchar(__c);
          }
          else {
            uVar4 = 1 << ((byte)uVar10 & 0x1f);
            if (((*(byte *)(lVar6 + 0x107250 + uVar14) >> (uVar10 & 0x1f) & 1) == 0) ||
               ((uVar4 & *(byte *)(lVar6 + 0x107298 + uVar14)) != 0)) goto LAB_00103a35;
            if ((uVar4 & *(byte *)(lVar6 + 0x107208 + uVar14)) == 0) {
              pcVar12 = "%s0%s";
            }
            else {
              pcVar12 = "%s1%s";
            }
            printf(pcVar12,"\x1b[1m\x1b[31m","\x1b[0m");
          }
          bVar15 = uVar10 != 0;
          uVar10 = uVar10 - 1;
        } while (bVar15);
        if (binary_gap == '\x01') {
          putchar(0x20);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < sniftab[lVar5].current.len);
    }
    if (0 < iVar13) {
      do {
        printf("        ");
        if (binary_gap == '\x01') {
          putchar(0x20);
        }
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
  }
  putchar(10);
  __n = 8;
  if (max_dlen != '\0') {
    __n = 0x40;
  }
  memset(sniftab[lVar5].marker.data,0,__n);
  return;
}

Assistant:

void print_snifline(int slot)
{
	long diffsec  = sniftab[slot].currstamp.tv_sec  - sniftab[slot].laststamp.tv_sec;
	long diffusec = sniftab[slot].currstamp.tv_usec - sniftab[slot].laststamp.tv_usec;
	int dlc_diff  = sniftab[slot].last.len - sniftab[slot].current.len;
	canid_t cid = sniftab[slot].current.can_id;
	int i,j;

	if (diffusec < 0)
		diffsec--, diffusec += 1000000;

	if (diffsec < 0)
		diffsec = diffusec = 0;

	if (diffsec >= 100)
		diffsec = 99, diffusec = 999999;

	if (cid & CAN_EFF_FLAG)
		printf("%02ld%03ld%s%08X%s", diffsec, diffusec/1000, vdl, cid & CAN_EFF_MASK, vdl);
	else if (print_eff)
		printf("%02ld%03ld%s---- %03X%s", diffsec, diffusec/1000, vdl, cid & CAN_SFF_MASK, vdl);
	else
		printf("%02ld%03ld%s%03X%s", diffsec, diffusec/1000, ldl, cid & CAN_SFF_MASK, ldl);

	if (binary) {
		for (i = 0; i < sniftab[slot].current.len; i++) {
			for (j=7; j >= 0; j--) {
				if ((color) && (sniftab[slot].marker.data[i] & 1<<j) &&
				    (!(sniftab[slot].notch.data[i] & 1<<j)))
					if (sniftab[slot].current.data[i] & 1<<j)
						printf("%s1%s", ATTCOLOR, ATTRESET);
					else
						printf("%s0%s", ATTCOLOR, ATTRESET);
				else
					if (sniftab[slot].current.data[i] & 1<<j)
						putchar('1');
					else
						putchar('0');
			}
			if (binary_gap)
				putchar(' ');
		}

		/*
		 * when the len decreased (dlc_diff > 0),
		 * we need to blank the former data printout
		 */
		for (i = 0; i < dlc_diff; i++) {
			printf("        ");
			if (binary_gap)
				putchar(' ');
		}

	} else { /* not binary -> hex data and ASCII output */

		for (i = 0; i < sniftab[slot].current.len; i++)
			if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
				printf("%s%02X%s ", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
			else
				printf("%02X ", sniftab[slot].current.data[i]);

		if (print_ascii) {
			/* jump to common start for ASCII output */
			if (sniftab[slot].current.len < max_dlen)
				printf("%*s", (max_dlen - sniftab[slot].current.len) * 3, "");

			for (i = 0; i < sniftab[slot].current.len; i++)
				if ((sniftab[slot].current.data[i] > 0x1F) &&
				    (sniftab[slot].current.data[i] < 0x7F))
					if ((color) && (sniftab[slot].marker.data[i] & ~sniftab[slot].notch.data[i]))
						printf("%s%c%s", ATTCOLOR, sniftab[slot].current.data[i], ATTRESET);
					else
						putchar(sniftab[slot].current.data[i]);
				else
					putchar('.');

			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				putchar(' ');
		} else {
			/*
			 * when the len decreased (dlc_diff > 0),
			 * we need to blank the former data printout
			 */
			for (i = 0; i < dlc_diff; i++)
				printf("   ");
		}
	}

	putchar('\n');

	memset(&sniftab[slot].marker.data, 0, max_dlen);
}